

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

bool testing::internal::ParameterizedTestSuiteInfo<crashProblems>::IsValidParamName(string *name)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  
  sVar1 = name->_M_string_length;
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    pcVar2 = (name->_M_dataplus)._M_p;
    lVar6 = 0;
    do {
      uVar5 = (uint)(byte)pcVar2[lVar6];
      iVar4 = isalnum(uVar5);
      bVar3 = iVar4 != 0 || uVar5 == 0x5f;
      if (iVar4 == 0 && uVar5 != 0x5f) {
        return bVar3;
      }
      bVar7 = sVar1 - 1 != lVar6;
      lVar6 = lVar6 + 1;
    } while (bVar7);
  }
  return bVar3;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }